

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

int secp256k1_musig_pubkey_get
              (secp256k1_context *ctx,secp256k1_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge *in_stack_fffffffffffffee8;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffef0;
  secp256k1_context *in_stack_fffffffffffffef8;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_keyagg_cache_load
                        (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         (secp256k1_musig_keyagg_cache *)in_stack_fffffffffffffee8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_pubkey_save
                  ((secp256k1_pubkey *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_pubkey_get(const secp256k1_context* ctx, secp256k1_pubkey *agg_pk, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(agg_pk != NULL);
    memset(agg_pk, 0, sizeof(*agg_pk));
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_pubkey_save(agg_pk, &cache_i.pk);
    return 1;
}